

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT *nodes)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  REF_INT new_cell;
  REF_INT local_14;
  
  if ((long)ref_cell->node_per < 1) {
    uVar3 = 0;
  }
  else {
    lVar4 = 0;
    bVar5 = false;
    do {
      bVar1 = !bVar5;
      bVar5 = true;
      if (bVar1) {
        bVar5 = ref_subdiv->grid->mpi->id == ref_subdiv->grid->node->part[nodes[lVar4]];
      }
      lVar4 = lVar4 + 1;
    } while (ref_cell->node_per != lVar4);
    uVar3 = 0;
    if (bVar5) {
      uVar2 = ref_cell_add(ref_cell,nodes,&local_14);
      uVar3 = 0;
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x402,"ref_subdiv_add_local_cell",(ulong)uVar2,"add");
        uVar3 = uVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_add_local_cell(REF_SUBDIV ref_subdiv,
                                                    REF_CELL ref_cell,
                                                    REF_INT *nodes) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_subdiv_mpi(ref_subdiv)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}